

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTSIZEEnc(octet *der,u32 tag,size_t val)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  octet *der_00;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  lVar4 = 1;
  sVar6 = val;
  uVar7 = val;
  if (0xff < val) {
    do {
      sVar6 = uVar7 >> 8;
      lVar4 = lVar4 + 1;
      bVar1 = 0xffff < uVar7;
      uVar7 = sVar6;
    } while (bVar1);
  }
  sVar2 = derTEnc(der,tag);
  sVar5 = 0xffffffffffffffff;
  if (sVar2 != 0xffffffffffffffff) {
    sVar6 = (sVar6 >> 7) + lVar4;
    der_00 = der + sVar2;
    if (der == (octet *)0x0) {
      der_00 = (octet *)0x0;
    }
    sVar3 = derLEnc(der_00,sVar6);
    if (sVar3 != 0xffffffffffffffff) {
      if ((der != (octet *)0x0) && (sVar6 != 0)) {
        sVar5 = sVar6;
        do {
          der[sVar5 + sVar3 + sVar2 + -1] = (octet)val;
          sVar5 = sVar5 - 1;
          val = val >> 8;
        } while (sVar5 != 0);
      }
      sVar5 = sVar2 + sVar6 + sVar3;
    }
  }
  return sVar5;
}

Assistant:

size_t derTSIZEEnc(octet der[], u32 tag, size_t val)
{
	size_t len = 1;
	size_t t_count;
	size_t l_count;
	// определить длину V
	{
		register size_t v = val;
		for (; v >= 256; v >>= 8, ++len);
		len += v >> 7, v = 0;
	}
	// кодировать T
	t_count = derTEnc(der, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать L
	l_count = derLEnc(der ? der + t_count : 0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать V
	if (der)
	{
		size_t pos = len;
		der += t_count + l_count;
		ASSERT(memIsValid(der, len));
		for (; pos--; val >>= 8)
			der[pos] = (octet)val;
	}
	return t_count + l_count + len;
}